

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DiagObjectModel.cpp
# Opt level: O0

WeakArenaReference<Js::IDiagObjectModelWalkerBase> * __thiscall
Js::RecyclableKeyValueDisplay::CreateWalker(RecyclableKeyValueDisplay *this)

{
  ThreadContext *this_00;
  DebugManager *this_01;
  ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL> *pAVar1;
  RecyclableKeyValueWalker *this_02;
  HeapAllocator *alloc;
  RecyclableKeyValueDisplay *this_03;
  TrackAllocData local_88;
  code *local_60;
  undefined8 local_58;
  TrackAllocData local_50;
  RecyclableKeyValueWalker *local_28;
  IDiagObjectModelWalkerBase *pOMWalker;
  ReferencedArenaAdapter *pRefArena;
  RecyclableKeyValueDisplay *this_local;
  
  pRefArena = (ReferencedArenaAdapter *)this;
  this_00 = ScriptContext::GetThreadContext(this->scriptContext);
  this_01 = ThreadContext::GetDebugManager(this_00);
  pOMWalker = (IDiagObjectModelWalkerBase *)DebugManager::GetDiagnosticArena(this_01);
  if ((ReferencedArenaAdapter *)pOMWalker == (ReferencedArenaAdapter *)0x0) {
    this_local = (RecyclableKeyValueDisplay *)0x0;
  }
  else {
    pAVar1 = &Memory::ReferencedArenaAdapter::Arena((ReferencedArenaAdapter *)pOMWalker)->
              super_ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>;
    Memory::TrackAllocData::CreateTrackAllocData
              (&local_50,(type_info *)&RecyclableKeyValueWalker::typeinfo,0,0xffffffffffffffff,
               "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Debug/DiagObjectModel.cpp"
               ,0xe40);
    pAVar1 = Memory::ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>::
             TrackAllocInfo(pAVar1,&local_50);
    local_60 = Memory::ArenaAllocator::Alloc;
    local_58 = 0;
    this_02 = (RecyclableKeyValueWalker *)
              new<Memory::ArenaAllocator>(0x20,(ArenaAllocator *)pAVar1,0x3f67b0);
    RecyclableKeyValueWalker::RecyclableKeyValueWalker
              (this_02,this->scriptContext,this->key,this->value);
    local_28 = this_02;
    Memory::TrackAllocData::CreateTrackAllocData
              (&local_88,
               (type_info *)&Memory::WeakArenaReference<Js::IDiagObjectModelWalkerBase>::typeinfo,0,
               0xffffffffffffffff,
               "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Debug/DiagObjectModel.cpp"
               ,0xe41);
    alloc = Memory::HeapAllocator::TrackAllocInfo(&Memory::HeapAllocator::Instance,&local_88);
    this_03 = (RecyclableKeyValueDisplay *)new<Memory::HeapAllocator>(0x10,alloc,0x350bd0);
    Memory::WeakArenaReference<Js::IDiagObjectModelWalkerBase>::WeakArenaReference
              ((WeakArenaReference<Js::IDiagObjectModelWalkerBase> *)this_03,
               (ReferencedArenaAdapter *)pOMWalker,&local_28->super_IDiagObjectModelWalkerBase);
    this_local = this_03;
  }
  return (WeakArenaReference<Js::IDiagObjectModelWalkerBase> *)this_local;
}

Assistant:

WeakArenaReference<IDiagObjectModelWalkerBase>* RecyclableKeyValueDisplay::CreateWalker()
    {
        ReferencedArenaAdapter* pRefArena = scriptContext->GetThreadContext()->GetDebugManager()->GetDiagnosticArena();
        if (pRefArena)
        {
            IDiagObjectModelWalkerBase* pOMWalker = Anew(pRefArena->Arena(), RecyclableKeyValueWalker, scriptContext, key, value);
            return HeapNew(WeakArenaReference<IDiagObjectModelWalkerBase>, pRefArena, pOMWalker);
        }
        return nullptr;
    }